

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O3

void __thiscall
leveldb::InternalKey::InternalKey(InternalKey *this,Slice *user_key,SequenceNumber s,ValueType t)

{
  ParsedInternalKey local_38;
  
  (this->rep_)._M_dataplus._M_p = (pointer)&(this->rep_).field_2;
  (this->rep_)._M_string_length = 0;
  (this->rep_).field_2._M_local_buf[0] = '\0';
  local_38.user_key.data_ = user_key->data_;
  local_38.user_key.size_ = user_key->size_;
  local_38.sequence = s;
  local_38.type = t;
  AppendInternalKey(&this->rep_,&local_38);
  return;
}

Assistant:

InternalKey(const Slice& user_key, SequenceNumber s, ValueType t) {
    AppendInternalKey(&rep_, ParsedInternalKey(user_key, s, t));
  }